

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::MultiplicativeExpressionNode::~MultiplicativeExpressionNode
          (MultiplicativeExpressionNode *this)

{
  MultiplicativeExpressionNode *this_local;
  
  ~MultiplicativeExpressionNode(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kMultiplyType:
                            out << "    mul\n";
                            break;
                        case kDivideType:
                            out << "    div\n";
                            break;
                        case kModuloType:
                            out << "    mod\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }